

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

float Map_MappingGetAreaFlow(Map_Man_t *p)

{
  int iVar1;
  Map_Node_t *p_00;
  int local_2c;
  uint local_28;
  int i;
  int fPosPol;
  float aFlowFlowTotal;
  Map_Cut_t *pCut;
  Map_Node_t *pNode;
  Map_Man_t *p_local;
  
  i = 0;
  for (local_2c = 0; local_2c < p->nOutputs; local_2c = local_2c + 1) {
    p_00 = (Map_Node_t *)((ulong)p->pOutputs[local_2c] & 0xfffffffffffffffe);
    iVar1 = Map_NodeIsAnd(p_00);
    if (iVar1 != 0) {
      local_28 = (uint)((((ulong)p->pOutputs[local_2c] & 1) != 0 ^ 0xffU) & 1);
      if (p_00->pCutBest[(int)local_28] == (Map_Cut_t *)0x0) {
        local_28 = (uint)((local_28 != 0 ^ 0xffU) & 1);
      }
      i = (int)(p_00->pCutBest[(int)local_28]->M[(int)local_28].AreaFlow + (float)i);
    }
  }
  return (float)i;
}

Assistant:

float Map_MappingGetAreaFlow( Map_Man_t * p )
{
    Map_Node_t * pNode;
    Map_Cut_t * pCut;
    float aFlowFlowTotal = 0;
    int fPosPol, i;
    for ( i = 0; i < p->nOutputs; i++ )
    {
        pNode = Map_Regular(p->pOutputs[i]);
        if ( !Map_NodeIsAnd(pNode) )
            continue;
        fPosPol = !Map_IsComplement(p->pOutputs[i]);
        pCut = pNode->pCutBest[fPosPol];
        if ( pCut == NULL )
        {
            fPosPol = !fPosPol;
            pCut = pNode->pCutBest[fPosPol];
        }
        aFlowFlowTotal += pNode->pCutBest[fPosPol]->M[fPosPol].AreaFlow;
    }
    return aFlowFlowTotal;
}